

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O0

void __thiscall TimerHeap::pop(TimerHeap *this,size_t index)

{
  size_type sVar1;
  size_t index_local;
  TimerHeap *this_local;
  
  sVar1 = std::vector<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>::size
                    (&this->timerHeap_);
  if (sVar1 - 1 == index) {
    std::vector<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>::pop_back
              (&this->timerHeap_);
  }
  else {
    sVar1 = std::vector<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>::size
                      (&this->timerHeap_);
    swapHeap(this,index,sVar1 - 1);
    std::vector<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>::pop_back
              (&this->timerHeap_);
    modify(this,index);
  }
  return;
}

Assistant:

void TimerHeap::pop(size_t index) {
    if (timerHeap_.size() - 1 == index) {
        timerHeap_.pop_back();
    } else {
        swapHeap(index, timerHeap_.size() - 1);
        timerHeap_.pop_back();
        modify(index);
    }
}